

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int little2_contentTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  byte *pbVar7;
  char *pcVar8;
  byte *pbVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  byte bVar14;
  bool bVar15;
  
  if (end <= ptr) {
    return -4;
  }
  uVar10 = (long)end - (long)ptr & 0xfffffffffffffffe;
  pcVar6 = ptr + uVar10;
  if (uVar10 == 0) {
    pcVar6 = end;
  }
  bVar15 = ((long)end - (long)ptr & 1U) != 0;
  if (!bVar15) {
    pcVar6 = end;
  }
  if (bVar15 && uVar10 == 0) {
    return -1;
  }
  bVar1 = ptr[1];
  pbVar7 = (byte *)ptr;
  if (0xdb < bVar1) {
    if ((bVar1 - 0xdc < 4) || ((bVar1 == 0xff && (0xfd < (byte)*ptr)))) {
switchD_0043e552_caseD_0:
      *nextTokPtr = (char *)pbVar7;
      return 0;
    }
    goto switchD_0043e552_default;
  }
  if (bVar1 - 0xd8 < 4) {
switchD_0043e552_caseD_7:
    if ((long)pcVar6 - (long)ptr < 4) {
      return -2;
    }
    pbVar7 = (byte *)(ptr + 4);
    goto joined_r0x0043e5c3;
  }
  if (bVar1 != 0) goto switchD_0043e552_default;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 0:
  case 1:
  case 8:
    goto switchD_0043e552_caseD_0;
  case 2:
    pbVar9 = (byte *)(ptr + 2);
    uVar10 = (long)pcVar6 - (long)pbVar9;
    if ((long)uVar10 < 2) {
      return -1;
    }
    bVar1 = ptr[3];
    if (bVar1 < 0xdc) {
      if (bVar1 - 0xd8 < 4) {
switchD_0043e7da_caseD_7:
        if (uVar10 < 4) {
          return -2;
        }
        goto switchD_0043e7da_caseD_5;
      }
      if (bVar1 == 0) {
        uVar12 = (uint)*pbVar9;
        cVar2 = *(char *)((long)enc[1].scanners + (ulong)*pbVar9);
        switch(cVar2) {
        case '\x05':
        case '\b':
        case '\t':
        case '\n':
        case '\v':
        case '\f':
        case '\r':
        case '\x0e':
        case '\x12':
        case '\x13':
        case '\x14':
        case '\x15':
        case '\x17':
          break;
        case '\x06':
          if (uVar10 == 2) {
            return -2;
          }
          break;
        case '\a':
          goto switchD_0043e7da_caseD_7;
        case '\x0f':
          iVar5 = little2_scanPi(enc,ptr + 4,pcVar6,nextTokPtr);
          return iVar5;
        case '\x10':
          pbVar9 = (byte *)(ptr + 4);
          if ((long)pcVar6 - (long)pbVar9 < 2) {
            return -1;
          }
          if (ptr[5] == '\0') {
            cVar2 = *(char *)((long)enc[1].scanners + (ulong)*pbVar9);
            if (cVar2 == '\x14') {
              pcVar8 = ptr + 6;
              if ((long)pcVar6 - (long)pcVar8 < 0xc) {
                return -1;
              }
              iVar5 = 0;
              lVar11 = 0;
              do {
                if ((pcVar8[1] != '\0') || (*pcVar8 != (&big2_scanCdataSection_CDATA_LSQB)[lVar11]))
                goto LAB_0043ed34;
                lVar11 = lVar11 + 1;
                pcVar8 = pcVar8 + 2;
              } while (lVar11 != 6);
              iVar5 = 8;
              pcVar8 = ptr + 0x12;
LAB_0043ed34:
              *nextTokPtr = pcVar8;
              return iVar5;
            }
            if (cVar2 == '\x1b') {
              iVar5 = little2_scanComment(enc,ptr + 6,pcVar6,nextTokPtr);
              return iVar5;
            }
          }
          break;
        case '\x11':
          pbVar7 = (byte *)(ptr + 4);
          uVar10 = (long)pcVar6 - (long)pbVar7;
          if ((long)uVar10 < 2) {
            return -1;
          }
          bVar1 = ptr[5];
          iVar5 = 0;
          if (bVar1 < 0xdc) {
            if (3 < bVar1 - 0xd8) {
              if (bVar1 != 0) {
LAB_0043ebef:
                bVar14 = *pbVar7;
                goto LAB_0043ebf2;
              }
              bVar14 = *pbVar7;
              bVar3 = *(byte *)((long)enc[1].scanners + (ulong)bVar14);
              if (0x15 < bVar3) {
                if ((bVar3 == 0x16) || (bVar3 == 0x18)) goto LAB_0043ec27;
                if (bVar3 != 0x1d) goto LAB_0043ea19;
                goto LAB_0043ebf2;
              }
              if (bVar3 == 6) {
                if (uVar10 == 2) {
                  return -2;
                }
                goto LAB_0043ea19;
              }
              if (bVar3 != 7) goto LAB_0043ea19;
            }
            iVar5 = 0;
            if (uVar10 < 4) {
              return -2;
            }
          }
          else {
            if (bVar1 - 0xdc < 4) goto LAB_0043ea19;
            if (bVar1 != 0xff) goto LAB_0043ebef;
            bVar14 = *pbVar7;
            if (0xfd < bVar14) goto LAB_0043ea19;
LAB_0043ebf2:
            if ((*(uint *)((long)namingBitmap +
                          (ulong)(bVar14 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)
                          ) >> (bVar14 & 0x1f) & 1) != 0) {
LAB_0043ec27:
              if ((long)(pcVar6 + (-6 - (long)ptr)) < 2) {
                return -1;
              }
              lVar13 = 6;
              lVar11 = 0;
LAB_0043ec56:
              bVar1 = ptr[lVar13 + 1];
              if (0xdb < bVar1) {
                if (bVar1 == 0xff) {
                  uVar12 = (uint)(byte)ptr[lVar13];
                  if ((byte)ptr[lVar13] < 0xfe) goto switchD_0043ec8d_caseD_1d;
                }
                else if (3 < bVar1 - 0xdc) goto LAB_0043ecc9;
                goto switchD_0043ec8d_caseD_8;
              }
              if (bVar1 != 0) {
                if (3 < bVar1 - 0xd8) {
LAB_0043ecc9:
                  uVar12 = (uint)(byte)ptr[lVar13];
                  goto switchD_0043ec8d_caseD_1d;
                }
switchD_0043ec8d_caseD_7:
                if (pcVar6 + (lVar11 - (long)ptr) + -6 < (char *)0x4) {
                  return -2;
                }
                goto switchD_0043ec8d_caseD_8;
              }
              uVar12 = (uint)(byte)ptr[lVar13];
              switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)ptr[lVar13])) {
              case 6:
                if (pcVar6 + (lVar11 - (long)ptr) == (char *)0x8) {
                  return -2;
                }
                break;
              case 7:
                goto switchD_0043ec8d_caseD_7;
              case 9:
              case 10:
              case 0x15:
                pcVar6 = pcVar6 + (lVar11 - (long)ptr) + -8;
                if ((long)pcVar6 < 2) {
                  return -1;
                }
                pbVar7 = (byte *)(ptr + (8 - lVar11));
                goto LAB_0043ee02;
              case 0xb:
                pbVar7 = (byte *)(ptr + (8 - lVar11));
                iVar5 = 5;
                goto LAB_0043ea19;
              case 0x16:
              case 0x18:
              case 0x19:
              case 0x1a:
              case 0x1b:
                goto switchD_0043ec8d_caseD_16;
              case 0x1d:
switchD_0043ec8d_caseD_1d:
                if ((*(uint *)((long)namingBitmap +
                              (ulong)(uVar12 >> 3 & 0x1c |
                                     (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
                     (uVar12 & 0x1f) & 1) != 0) goto switchD_0043ec8d_caseD_16;
              }
switchD_0043ec8d_caseD_8:
              pbVar7 = (byte *)(ptr + (6 - lVar11));
              iVar5 = 0;
            }
          }
LAB_0043ea19:
          *nextTokPtr = (char *)pbVar7;
          return iVar5;
        case '\x16':
        case '\x18':
          goto switchD_0043e7da_caseD_16;
        default:
          if (cVar2 != '\x1d') break;
          goto LAB_0043e805;
        }
        goto switchD_0043e7da_caseD_5;
      }
LAB_0043e802:
      uVar12 = (uint)*pbVar9;
    }
    else {
      if (bVar1 - 0xdc < 4) goto switchD_0043e7da_caseD_5;
      if (bVar1 != 0xff) goto LAB_0043e802;
      uVar12 = (uint)*pbVar9;
      if (0xfd < *pbVar9) goto switchD_0043e7da_caseD_5;
    }
LAB_0043e805:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)(uVar12 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
         (uVar12 & 0x1f) & 1) != 0) {
switchD_0043e7da_caseD_16:
      if ((long)(pcVar6 + (-4 - (long)ptr)) < 2) {
        return -1;
      }
      lVar13 = 4;
      lVar11 = 0;
LAB_0043e86f:
      bVar1 = ptr[lVar13 + 1];
      if (0xdb < bVar1) {
        if (bVar1 == 0xff) {
          bVar14 = ptr[lVar13];
          if (bVar14 < 0xfe) goto switchD_0043e8a6_caseD_1d;
        }
        else if (3 < bVar1 - 0xdc) goto LAB_0043e8db;
        goto switchD_0043e8a6_caseD_5;
      }
      if (bVar1 != 0) {
        if (3 < bVar1 - 0xd8) {
LAB_0043e8db:
          bVar14 = ptr[lVar13];
          goto switchD_0043e8a6_caseD_1d;
        }
switchD_0043e8a6_caseD_7:
        if (pcVar6 + (lVar11 - (long)ptr) + -4 < (char *)0x4) {
          return -2;
        }
        goto switchD_0043e8a6_caseD_5;
      }
      bVar14 = ptr[lVar13];
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)bVar14)) {
      case 6:
        if (pcVar6 + (lVar11 - (long)ptr) == (char *)0x6) {
          return -2;
        }
        break;
      case 7:
        goto switchD_0043e8a6_caseD_7;
      case 9:
      case 10:
      case 0x15:
        if ((long)(pcVar6 + (lVar11 - (long)ptr) + -6) < 2) {
          return -1;
        }
        pbVar7 = (byte *)(ptr + (6 - lVar11));
        pcVar8 = pcVar6 + (lVar11 - (long)ptr) + -8;
        goto LAB_0043ea4b;
      case 0xb:
        pbVar7 = (byte *)(ptr + (4 - lVar11));
        goto switchD_0043ea7b_caseD_b;
      case 0x11:
        pbVar7 = (byte *)(ptr + (4 - lVar11));
        goto switchD_0043ea7b_caseD_11;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_0043e8a6_caseD_16;
      case 0x1d:
switchD_0043e8a6_caseD_1d:
        if ((*(uint *)((long)namingBitmap +
                      (ulong)(bVar14 >> 3 & 0x1c | (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)
                      ) >> (bVar14 & 0x1f) & 1) != 0) goto switchD_0043e8a6_caseD_16;
      }
switchD_0043e8a6_caseD_5:
      pbVar7 = (byte *)(ptr + (4 - lVar11));
      goto switchD_0043e552_caseD_0;
    }
switchD_0043e7da_caseD_5:
    *nextTokPtr = (char *)pbVar9;
    return 0;
  case 3:
    iVar5 = little2_scanRef(enc,ptr + 2,pcVar6,nextTokPtr);
    return iVar5;
  case 4:
    pbVar7 = (byte *)(ptr + 2);
    if ((long)pcVar6 - (long)pbVar7 < 2) {
      return -5;
    }
    if ((ptr[3] == '\0') && (*pbVar7 == 0x5d)) {
      pcVar8 = ptr + 4;
      if ((long)pcVar6 - (long)pcVar8 < 2) {
        return -5;
      }
      if ((ptr[5] == '\0') && (*pcVar8 == '>')) {
        *nextTokPtr = pcVar8;
        return 0;
      }
    }
    break;
  case 5:
    if ((long)pcVar6 - (long)ptr < 2) {
      return -2;
    }
  default:
switchD_0043e552_default:
    pbVar7 = (byte *)(ptr + 2);
    break;
  case 6:
    if ((long)pcVar6 - (long)ptr < 3) {
      return -2;
    }
    pbVar7 = (byte *)(ptr + 3);
    break;
  case 7:
    goto switchD_0043e552_caseD_7;
  case 9:
    pcVar8 = ptr + 2;
    if (1 < (long)pcVar6 - (long)pcVar8) {
      if ((ptr[3] == '\0') && (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[2]) == '\n')) {
        pcVar8 = ptr + 4;
      }
      *nextTokPtr = pcVar8;
      return 7;
    }
    return -3;
  case 10:
    *nextTokPtr = ptr + 2;
    return 7;
  }
joined_r0x0043e5c3:
  do {
    while( true ) {
      pbVar9 = pbVar7;
      uVar10 = (long)pcVar6 - (long)pbVar9;
      if ((long)uVar10 < 2) {
        *nextTokPtr = (char *)pbVar9;
        return 6;
      }
      bVar1 = pbVar9[1];
      if (0xdb < bVar1) {
        if (bVar1 == 0xff) {
          if (0xfd < *pbVar9) goto switchD_0043e62e_caseD_0;
        }
        else if (bVar1 - 0xdc < 4) goto switchD_0043e62e_caseD_0;
        goto switchD_0043e62e_caseD_5;
      }
      if (3 < bVar1 - 0xd8) break;
switchD_0043e62e_caseD_7:
      if (uVar10 < 4) goto switchD_0043e62e_caseD_0;
      pbVar7 = pbVar9 + 4;
    }
    if (bVar1 == 0) {
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar9)) {
      case 4:
        goto switchD_0043e62e_caseD_4;
      default:
        break;
      case 6:
        if (uVar10 != 2) {
          pbVar7 = pbVar9 + 3;
          goto joined_r0x0043e5c3;
        }
      case 0:
      case 1:
      case 2:
      case 3:
      case 8:
      case 9:
      case 10:
switchD_0043e62e_caseD_0:
        *nextTokPtr = (char *)pbVar9;
        return 6;
      case 7:
        goto switchD_0043e62e_caseD_7;
      }
    }
switchD_0043e62e_caseD_5:
    pbVar7 = pbVar9 + 2;
  } while( true );
switchD_0043e62e_caseD_4:
  if (uVar10 < 4) goto switchD_0043e62e_caseD_0;
  pbVar7 = pbVar9 + 2;
  if ((pbVar9[3] != 0) || (*pbVar7 != 0x5d)) goto joined_r0x0043e5c3;
  if (uVar10 < 6) goto switchD_0043e62e_caseD_0;
  if ((pbVar9[5] != 0) || (pbVar9[4] != 0x3e)) goto joined_r0x0043e5c3;
  pbVar9 = pbVar9 + 4;
  goto switchD_0043e7da_caseD_5;
switchD_0043e8a6_caseD_16:
  lVar4 = lVar11 - (long)ptr;
  lVar11 = lVar11 + -2;
  lVar13 = lVar13 + 2;
  if ((long)(pcVar6 + lVar4 + -6) < 2) {
    return -1;
  }
  goto LAB_0043e86f;
LAB_0043ea4b:
  bVar1 = pbVar7[1];
  uVar10 = (ulong)bVar1;
  if (bVar1 == 0) {
    uVar12 = (uint)*pbVar7;
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar7)) {
    default:
      goto switchD_0043e552_caseD_0;
    case 6:
      if (pcVar8 == (char *)0x0) {
        return -2;
      }
      goto switchD_0043e552_caseD_0;
    case 7:
      goto switchD_0043ea7b_caseD_7;
    case 9:
    case 10:
    case 0x15:
      pbVar7 = pbVar7 + 2;
      bVar15 = (long)pcVar8 < 2;
      pcVar8 = pcVar8 + -2;
      if (bVar15) {
        return -1;
      }
      goto LAB_0043ea4b;
    case 0xb:
      goto switchD_0043ea7b_caseD_b;
    case 0x11:
      goto switchD_0043ea7b_caseD_11;
    case 0x16:
    case 0x18:
      goto switchD_0043ea7b_caseD_16;
    case 0x1d:
      uVar10 = 0;
    }
  }
  else {
    if (bVar1 - 0xd8 < 4) {
switchD_0043ea7b_caseD_7:
      if (pcVar8 + 2 < (char *)0x4) {
        return -2;
      }
      goto switchD_0043e552_caseD_0;
    }
    if (bVar1 - 0xdc < 4) goto switchD_0043e552_caseD_0;
    if (bVar1 != 0xff) {
      uVar12 = (uint)*pbVar7;
      goto LAB_0043eda1;
    }
    uVar12 = (uint)*pbVar7;
    uVar10 = 0xff;
    if (0xfd < *pbVar7) goto switchD_0043e552_caseD_0;
  }
LAB_0043eda1:
  if ((*(uint *)((long)namingBitmap +
                (ulong)(uVar12 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[uVar10] << 5)) >>
       (uVar12 & 0x1f) & 1) != 0) {
switchD_0043ea7b_caseD_16:
    iVar5 = little2_scanAtts(enc,(char *)(pbVar7 + 2),pcVar6,nextTokPtr);
    return iVar5;
  }
  goto switchD_0043e552_caseD_0;
switchD_0043ec8d_caseD_16:
  lVar4 = lVar11 - (long)ptr;
  lVar11 = lVar11 + -2;
  lVar13 = lVar13 + 2;
  if ((long)(pcVar6 + lVar4 + -8) < 2) {
    return -1;
  }
  goto LAB_0043ec56;
LAB_0043ee02:
  iVar5 = 0;
  if (pbVar7[1] != 0) goto LAB_0043ea19;
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar7);
  if ((1 < bVar1 - 9) && (bVar1 != 0x15)) {
    if (bVar1 == 0xb) {
      pbVar7 = pbVar7 + 2;
      iVar5 = 5;
    }
    goto LAB_0043ea19;
  }
  pbVar7 = pbVar7 + 2;
  pcVar6 = pcVar6 + -2;
  if ((long)pcVar6 < 2) {
    return -1;
  }
  goto LAB_0043ee02;
switchD_0043ea7b_caseD_b:
  *nextTokPtr = (char *)(pbVar7 + 2);
  return 2;
switchD_0043ea7b_caseD_11:
  pbVar9 = pbVar7 + 2;
  if ((long)pcVar6 - (long)pbVar9 < 2) {
    return -1;
  }
  if ((pbVar7[3] == 0) && (*pbVar9 == 0x3e)) {
    *nextTokPtr = (char *)(pbVar7 + 4);
    return 4;
  }
  *nextTokPtr = (char *)pbVar9;
  return 0;
}

Assistant:

static int PTRCALL
PREFIX(contentTok)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **nextTokPtr)
{
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_LT:
    return PREFIX(scanLt)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_AMP:
    return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_CR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_CR;
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (!CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) { \
        *nextTokPtr = ptr; \
        return XML_TOK_DATA_CHARS; \
      } \
      ptr += n; \
      break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_RSQB:
      if (HAS_CHARS(enc, ptr, end, 2)) {
         if (!CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_RSQB)) {
           ptr += MINBPC(enc);
           break;
         }
         if (HAS_CHARS(enc, ptr, end, 3)) {
           if (!CHAR_MATCHES(enc, ptr + 2*MINBPC(enc), ASCII_GT)) {
             ptr += MINBPC(enc);
             break;
           }
           *nextTokPtr = ptr + 2*MINBPC(enc);
           return XML_TOK_INVALID;
         }
      }
      /* fall through */
    case BT_AMP:
    case BT_LT:
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}